

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall AmpIO::DallasReadBlock(AmpIO *this,uchar *data,uint nbytes)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  if (((nbytes < 0x101) && (uVar2 != 0x64524131)) &&
     (pBVar1 = (this->super_FpgaIO).super_BoardIO.port, pBVar1 != (BasePort *)0x0)) {
    iVar3 = (*pBVar1->_vptr_BasePort[0x26])
                      (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,0x6000,data,
                       (ulong)nbytes);
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool AmpIO::DallasReadBlock(unsigned char *data, unsigned int nbytes) const
{
    if (GetHardwareVersion() == dRA1_String)
        return false;

    nodeaddr_t address = 0x6000;
    if (nbytes > 256)
        return false;
    if (port)
        return port->ReadBlock(BoardId, address, reinterpret_cast<quadlet_t *>(data), nbytes);
    return false;
}